

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

float64 log_diag_eval(vector_t obs,float32 norm,vector_t mean,vector_t var_fact,uint32 veclen)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  
  if (veclen == 0) {
    dVar3 = 0.0;
  }
  else if (veclen == 0x27) {
    dVar3 = 0.0;
    lVar1 = 0;
    do {
      dVar3 = dVar3 + (double)var_fact[lVar1] * (double)(obs[lVar1] - mean[lVar1]) *
                      (double)(obs[lVar1] - mean[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x27);
  }
  else if (veclen == 0x20) {
    dVar3 = 0.0;
    lVar1 = 0;
    do {
      dVar3 = dVar3 + (double)var_fact[lVar1] * (double)(obs[lVar1] - mean[lVar1]) *
                      (double)(obs[lVar1] - mean[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
  }
  else {
    dVar3 = 0.0;
    uVar2 = 0;
    do {
      dVar3 = dVar3 + (double)var_fact[uVar2] * (double)(obs[uVar2] - mean[uVar2]) *
                      (double)(obs[uVar2] - mean[uVar2]);
      uVar2 = uVar2 + 1;
    } while (veclen != uVar2);
  }
  return (float64)((double)(float)norm - dVar3);
}

Assistant:

float64
log_diag_eval(vector_t obs,
	      float32 norm,
	      vector_t mean,
	      vector_t var_fact,
	      uint32 veclen)
{
    float64 d = 0.0, diff;
    uint32 l;

    if (veclen == 39) {
	/* Most common case, optimized for loop unrolling */
        for (l = 0; l < 39; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    } else if (veclen == 32) {
	/* Most common case, optimized for loop unrolling */
        for (l = 0; l < 32; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    } else {
        for (l = 0; l < veclen; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    }
    
    return norm - d;	/* log (1 / 2 pi |sigma^2|) */
}